

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reciprocal.c
# Opt level: O0

uint64_t defyx_reciprocal(uint64_t divisor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint shift;
  uint64_t bit;
  uint bsr;
  uint64_t remainder;
  uint64_t quotient;
  uint64_t p2exp63;
  uint64_t divisor_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = divisor;
  quotient = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar1,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = divisor;
  remainder = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x8000000000000000)) % auVar2,0);
  bsr = 0;
  for (bit = divisor; bit != 0; bit = bit >> 1) {
    bsr = bsr + 1;
  }
  for (shift = 0; shift < bsr; shift = shift + 1) {
    if (remainder < divisor - remainder) {
      quotient = quotient << 1;
      remainder = remainder << 1;
    }
    else {
      quotient = quotient * 2 + 1;
      remainder = remainder * 2 - divisor;
    }
  }
  return quotient;
}

Assistant:

uint64_t defyx_reciprocal(uint64_t divisor) {

	assert(divisor != 0);

	const uint64_t p2exp63 = 1ULL << 63;

	uint64_t quotient = p2exp63 / divisor, remainder = p2exp63 % divisor;

	unsigned bsr = 0; //highest set bit in divisor

	for (uint64_t bit = divisor; bit > 0; bit >>= 1)
		bsr++;

	for (unsigned shift = 0; shift < bsr; shift++) {
		if (remainder >= divisor - remainder) {
			quotient = quotient * 2 + 1;
			remainder = remainder * 2 - divisor;
		}
		else {
			quotient = quotient * 2;
			remainder = remainder * 2;
		}
	}

	return quotient;
}